

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.cpp
# Opt level: O1

void __thiscall
cbtGImpactCompoundShape::calculateLocalInertia
          (cbtGImpactCompoundShape *this,cbtScalar mass,cbtVector3 *inertia)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  cbtScalar cVar5;
  cbtScalar cVar6;
  undefined8 uVar7;
  cbtCollisionShape *pcVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  int iVar15;
  int iVar16;
  cbtTransform *pcVar17;
  long lVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  cbtVector3 temp_inertia;
  float local_38;
  float local_34;
  float local_30;
  
  (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0x1c])();
  inertia->m_floats[0] = 0.0;
  inertia->m_floats[1] = 0.0;
  inertia->m_floats[2] = 0.0;
  inertia->m_floats[3] = 0.0;
  iVar15 = (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
             _vptr_cbtCollisionShape[0x16])(this);
  if (iVar15 != 0) {
    lVar18 = (long)iVar15;
    lVar19 = lVar18 << 6;
    do {
      lVar19 = lVar19 + -0x40;
      pcVar8 = (this->m_childShapes).m_data[lVar18 + -1];
      (*pcVar8->_vptr_cbtCollisionShape[8])((ulong)(uint)(mass / (float)iVar15),pcVar8,&local_38);
      iVar16 = (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.
                 super_cbtCollisionShape._vptr_cbtCollisionShape[0x17])(this);
      if ((char)iVar16 == '\0') {
        pcVar17 = cbtTransform::getIdentity();
        fVar1 = (pcVar17->m_basis).m_el[0].m_floats[0];
        fVar22 = (pcVar17->m_basis).m_el[0].m_floats[1];
        fVar10 = fVar1 * local_38;
        fVar26 = fVar22 * local_34;
        fVar2 = (pcVar17->m_basis).m_el[0].m_floats[2];
        fVar11 = fVar2 * local_30;
        fVar3 = (pcVar17->m_basis).m_el[1].m_floats[0];
        fVar12 = fVar3 * local_38;
        fVar27 = (pcVar17->m_basis).m_el[1].m_floats[1];
        fVar28 = fVar27 * local_34;
        fVar4 = (pcVar17->m_basis).m_el[1].m_floats[2];
        fVar13 = fVar4 * local_30;
        cVar5 = (pcVar17->m_basis).m_el[2].m_floats[0];
        auVar20 = vmulss_avx512f(ZEXT416((uint)local_38),ZEXT416((uint)cVar5));
        fVar24 = (pcVar17->m_basis).m_el[2].m_floats[1];
        fVar25 = local_34 * fVar24;
        cVar6 = (pcVar17->m_basis).m_el[2].m_floats[2];
      }
      else {
        lVar9 = *(long *)&this->field_0xd8;
        pcVar17 = (cbtTransform *)(lVar9 + lVar19);
        fVar1 = *(float *)(lVar9 + lVar19);
        fVar22 = *(float *)(lVar9 + 4 + lVar19);
        fVar10 = fVar1 * local_38;
        fVar26 = fVar22 * local_34;
        fVar2 = *(float *)(lVar9 + 8 + lVar19);
        fVar11 = fVar2 * local_30;
        fVar3 = *(float *)(lVar9 + 0x10 + lVar19);
        fVar12 = fVar3 * local_38;
        fVar27 = *(float *)(lVar9 + 0x14 + lVar19);
        fVar28 = fVar27 * local_34;
        fVar4 = *(float *)(lVar9 + 0x18 + lVar19);
        fVar13 = fVar4 * local_30;
        cVar5 = *(cbtScalar *)(lVar9 + 0x20 + lVar19);
        auVar20 = vmulss_avx512f(ZEXT416((uint)local_38),ZEXT416((uint)cVar5));
        fVar24 = *(float *)(lVar9 + 0x24 + lVar19);
        fVar25 = local_34 * fVar24;
        cVar6 = *(cbtScalar *)(lVar9 + 0x28 + lVar19);
      }
      auVar21 = vmulss_avx512f(ZEXT416((uint)local_30),ZEXT416((uint)cVar6));
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * fVar26)),ZEXT416((uint)fVar1),
                                ZEXT416((uint)fVar10));
      auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)fVar2),ZEXT416((uint)fVar11));
      auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * fVar28)),ZEXT416((uint)fVar3),
                                ZEXT416((uint)fVar12));
      auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)fVar4),ZEXT416((uint)fVar13));
      auVar20 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar24 * fVar25)),ZEXT416((uint)cVar5),auVar20);
      auVar21 = vfmadd231ss_avx512f(auVar20,ZEXT416((uint)cVar6),auVar21);
      lVar18 = lVar18 + -1;
      fVar22 = (pcVar17->m_origin).m_floats[0];
      fVar27 = (pcVar17->m_origin).m_floats[1];
      fVar22 = fVar22 * fVar22;
      fVar27 = fVar27 * fVar27;
      fVar24 = (pcVar17->m_origin).m_floats[2];
      fVar24 = fVar24 * fVar24;
      auVar20 = vinsertps_avx(ZEXT416((uint)(auVar14._0_4_ * (fVar27 + fVar24) +
                                            inertia->m_floats[0])),
                              ZEXT416((uint)(auVar23._0_4_ * (fVar22 + fVar24) +
                                            inertia->m_floats[1])),0x10);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
      auVar23._4_12_ = SUB1612(auVar14 << 0x40,4);
      auVar23._0_4_ = auVar21._0_4_ * (fVar22 + fVar27) + inertia->m_floats[2];
      uVar7 = vmovlps_avx(auVar20);
      *(undefined8 *)inertia->m_floats = uVar7;
      uVar7 = vmovlps_avx(auVar23);
      *(undefined8 *)(inertia->m_floats + 2) = uVar7;
    } while (lVar18 != 0);
  }
  (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0x1d])(this);
  return;
}

Assistant:

void cbtGImpactCompoundShape::calculateLocalInertia(cbtScalar mass, cbtVector3& inertia) const
{
	lockChildShapes();
#ifdef CALC_EXACT_INERTIA
	inertia.setValue(0.f, 0.f, 0.f);

	int i = this->getNumChildShapes();
	cbtScalar shapemass = mass / cbtScalar(i);

	while (i--)
	{
		cbtVector3 temp_inertia;
		m_childShapes[i]->calculateLocalInertia(shapemass, temp_inertia);
		if (childrenHasTransform())
		{
			inertia = gim_inertia_add_transformed(inertia, temp_inertia, m_childTransforms[i]);
		}
		else
		{
			inertia = gim_inertia_add_transformed(inertia, temp_inertia, cbtTransform::getIdentity());
		}
	}

#else

	// Calc box inertia

	cbtScalar lx = m_localAABB.m_max[0] - m_localAABB.m_min[0];
	cbtScalar ly = m_localAABB.m_max[1] - m_localAABB.m_min[1];
	cbtScalar lz = m_localAABB.m_max[2] - m_localAABB.m_min[2];
	const cbtScalar x2 = lx * lx;
	const cbtScalar y2 = ly * ly;
	const cbtScalar z2 = lz * lz;
	const cbtScalar scaledmass = mass * cbtScalar(0.08333333);

	inertia = scaledmass * (cbtVector3(y2 + z2, x2 + z2, x2 + y2));

#endif
	unlockChildShapes();
}